

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcLine::IfcLine(IfcLine *this)

{
  *(undefined ***)&this->field_0x50 = &PTR__Object_007631c0;
  *(undefined8 *)&this->field_0x58 = 0;
  *(char **)&this->field_0x60 = "IfcLine";
  IfcCurve::IfcCurve(&this->super_IfcCurve,&PTR_construction_vtable_24__007b5a70);
  *(undefined8 *)&(this->super_IfcCurve).field_0x38 = 0;
  (this->super_IfcCurve).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x7b59b8;
  *(undefined8 *)&this->field_0x50 = 0x7b5a58;
  *(undefined8 *)
   &(this->super_IfcCurve).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x7b59e0;
  *(undefined8 *)
   &(this->super_IfcCurve).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x7b5a08;
  *(undefined8 *)&(this->super_IfcCurve).super_IfcGeometricRepresentationItem.field_0x30 = 0x7b5a30;
  *(undefined8 *)&(this->super_IfcCurve).field_0x40 = 0;
  (this->Dir).obj = (LazyObject *)0x0;
  return;
}

Assistant:

IfcLine() : Object("IfcLine") {}